

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_proto_internal.h
# Opt level: O2

int encode_header(tnt_iheader *hdr,uint32_t code,uint64_t sync)

{
  char *pcVar1;
  
  hdr->header[0] = '\0';
  hdr->header[1] = '\0';
  hdr->header[2] = '\0';
  hdr->header[3] = '\0';
  hdr->header[4] = '\0';
  hdr->header[5] = '\0';
  hdr->header[6] = '\0';
  hdr->header[7] = '\0';
  hdr->header[8] = '\0';
  hdr->header[9] = '\0';
  hdr->header[10] = '\0';
  hdr->header[0xb] = '\0';
  hdr->header[0xc] = '\0';
  hdr->header[0xd] = '\0';
  hdr->header[0xe] = '\0';
  hdr->header[0xf] = '\0';
  hdr->end = (char *)0x0;
  hdr->header[0x10] = '\0';
  hdr->header[0x11] = '\0';
  hdr->header[0x12] = '\0';
  hdr->header[0x13] = '\0';
  hdr->header[0x14] = '\0';
  hdr->header[0x15] = '\0';
  hdr->header[0x16] = '\0';
  hdr->header[0x17] = '\0';
  *(undefined8 *)(hdr->header + 0x18) = 0;
  hdr->header[0] = -0x7e;
  pcVar1 = mp_encode_uint(hdr->header + 2,(ulong)code);
  *pcVar1 = '\x01';
  pcVar1 = mp_encode_uint(pcVar1 + 1,sync);
  hdr->end = pcVar1;
  return (int)pcVar1;
}

Assistant:

static inline int
encode_header(struct tnt_iheader *hdr, uint32_t code, uint64_t sync)
{
	memset(hdr, 0, sizeof(struct tnt_iheader));
	char *h = mp_encode_map(hdr->header, 2);
	h = mp_encode_uint(h, TNT_CODE);
	h = mp_encode_uint(h, code);
	h = mp_encode_uint(h, TNT_SYNC);
	h = mp_encode_uint(h, sync);
	hdr->end = h;
	return 0;
}